

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutahedral_representation_iterators.h
# Opt level: O0

void __thiscall
Gudhi::coxeter_triangulation::
Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
::increment(Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            *this)

{
  type_conflict tVar1;
  reference pvVar2;
  Ordered_set_partition_iterator *lhs;
  Integer_combination_iterator *lhs_00;
  OrderedSetPartition *this_00;
  reference this_01;
  reference this_02;
  const_reference pvVar3;
  uint local_28;
  uint local_24;
  uint j_1;
  uint local_18;
  uint local_14;
  uint j;
  uint i;
  Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *this_local;
  
  _j = this;
  for (local_14 = 0; local_14 < this->k_ + 1; local_14 = local_14 + 1) {
    pvVar2 = std::
             vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
             ::operator[](&this->o_its_,(ulong)local_14);
    lhs = boost::iterators::detail::
          iterator_facade_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_const_Gudhi::coxeter_triangulation::Ordered_set_partition,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Ordered_set_partition_&,_long,_false,_false>
          ::operator++((iterator_facade_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_const_Gudhi::coxeter_triangulation::Ordered_set_partition,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Ordered_set_partition_&,_long,_false,_false>
                        *)pvVar2);
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_const_Gudhi::coxeter_triangulation::Ordered_set_partition,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Ordered_set_partition_&,_long>
                        *)lhs,(iterator_facade<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_const_Gudhi::coxeter_triangulation::Ordered_set_partition,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Ordered_set_partition_&,_long>
                               *)&this->o_end_);
    if (tVar1) break;
  }
  if (local_14 == this->k_ + 1) {
    lhs_00 = boost::iterators::detail::
             iterator_facade_base<Gudhi::coxeter_triangulation::Integer_combination_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long,_false,_false>
             ::operator++((iterator_facade_base<Gudhi::coxeter_triangulation::Integer_combination_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long,_false,_false>
                           *)&this->i_it_);
    tVar1 = boost::iterators::operator==
                      ((iterator_facade<Gudhi::coxeter_triangulation::Integer_combination_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long>
                        *)lhs_00,
                       (iterator_facade<Gudhi::coxeter_triangulation::Integer_combination_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long>
                        *)&this->i_end_);
    if (tVar1) {
      this->is_end_ = true;
      return;
    }
    std::
    vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
    ::clear(&this->o_its_);
    for (local_18 = 0; local_18 < this->k_ + 1; local_18 = local_18 + 1) {
      this_00 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::partition(&this->simplex_);
      this_01 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[](this_00,(ulong)local_18);
      _j_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_01);
      this_02 = boost::iterators::detail::
                iterator_facade_base<Gudhi::coxeter_triangulation::Integer_combination_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long,_false,_false>
                ::operator*((iterator_facade_base<Gudhi::coxeter_triangulation::Integer_combination_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long,_false,_false>
                             *)&this->i_it_);
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (this_02,(ulong)local_18);
      local_24 = *pvVar3 + 1;
      std::
      vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>>
      ::emplace_back<unsigned_long,unsigned_int>
                ((vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>>
                  *)&this->o_its_,(unsigned_long *)&j_1,&local_24);
    }
  }
  else {
    for (local_28 = 0; local_28 < local_14; local_28 = local_28 + 1) {
      pvVar2 = std::
               vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
               ::operator[](&this->o_its_,(ulong)local_28);
      Ordered_set_partition_iterator::reinitialize(pvVar2);
    }
  }
  update_value(this);
  return;
}

Assistant:

void increment() {
    uint i = 0;
    for (; i < k_ + 1; i++) {
      if (++(o_its_[i]) != o_end_) break;
    }
    if (i == k_ + 1) {
      if (++i_it_ == i_end_) {
        is_end_ = true;
        return;
      }
      o_its_.clear();
      for (uint j = 0; j < k_ + 1; j++)
        o_its_.emplace_back(simplex_.partition()[j].size(), (*i_it_)[j] + 1);
    } else
      for (uint j = 0; j < i; j++) o_its_[j].reinitialize();
    update_value();
  }